

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_compress1X_usingCTable_internal_default
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  long lVar7;
  ulong *puVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  bool bVar14;
  HUF_CStream_t bitC;
  
  if (7 < dstSize) {
    bitC.bitPos[0] = 0;
    bitC.bitPos[1] = 0;
    bitC.bitContainer[0] = 0;
    bitC.bitContainer[1] = 0;
    bitC.endPtr = (BYTE *)((long)dst + (dstSize - 8));
    if (dstSize != 8) {
      uVar4 = (uint)*CTable;
      iVar11 = (int)srcSize;
      uVar3 = iVar11 >> 0x1f;
      bitC.ptr = (BYTE *)dst;
      bitC.startPtr = (BYTE *)dst;
      if (uVar4 < 0xc && ((*CTable & 0xffffffff) * srcSize >> 3) + 8 <= dstSize) {
        switch(uVar4) {
        case 7:
          uVar9 = (long)((ulong)uVar3 << 0x20 | srcSize & 0xffffffff) % 8;
          uVar12 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001817c7:
            if ((srcSize & 7) != 0) {
LAB_0018268b:
              __assert_fail("n % kUnroll == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x3ea8,
                            "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                           );
            }
            if ((srcSize & 8) == 0) {
LAB_001818a1:
              if ((srcSize & 0xf) != 0) {
LAB_001826aa:
                __assert_fail("n % (2 * kUnroll) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3eb4,
                              "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                             );
              }
              lVar1 = (long)(int)srcSize;
              lVar5 = (long)src + lVar1 + -1;
              lVar10 = lVar1 + -9 + (long)src;
              for (; bVar14 = lVar1 == 0, lVar7 = 7, 0 < lVar1; lVar1 = lVar1 + -0x10) {
                while (lVar7 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar5 + -7 + lVar7) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar7 = lVar7 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_00180eb8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar1 + -8 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                uVar12 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_00180eb8;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                puVar8 = (ulong *)(bitC.ptr + (uVar9 >> 3));
                if (bitC.endPtr < puVar8) {
LAB_0018262e:
                  __assert_fail("!kFast || bitC->ptr <= bitC->endPtr",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x3e72,"void HUF_flushBits(HUF_CStream_t *, int)");
                }
                sVar13 = 0;
                uVar9 = 0;
                lVar7 = 7;
                while (lVar7 != 0) {
                  uVar12 = CTable[(ulong)*(byte *)(lVar10 + -7 + lVar7) + 1];
                  if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                  uVar9 = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                  sVar13 = sVar13 + uVar12;
                  lVar7 = lVar7 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar13;
                  if (0x40 < ((uint)sVar13 & 0xff)) goto LAB_00180eb8;
                }
                uVar12 = CTable[(ulong)*(byte *)((long)src + lVar1 + -0x10) + 1];
                if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                bitC.bitPos[1] = sVar13 + uVar12;
                bitC.bitContainer[1] = uVar12 & 0xffffffffffffff00 | uVar9 >> ((byte)uVar12 & 0x3f);
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_00180eb8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_0018264d;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> ((byte)bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar12 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_0018266c;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                *puVar8 = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                bitC.ptr = (BYTE *)((uVar9 >> 3) + (long)puVar8);
                if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                lVar5 = lVar5 + -0x10;
                lVar10 = lVar10 + -0x10;
              }
LAB_001825ab:
              if (!bVar14) {
                __assert_fail("n == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3ecb,
                              "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                             );
              }
              if (bitC.ptr <= bitC.endPtr) {
                sVar13 = HUF_closeCStream(&bitC);
                return sVar13;
              }
              __assert_fail("bitC.ptr <= bitC.endPtr",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x3f16,
                            "size_t HUF_compress1X_usingCTable_internal_body(void *, size_t, const void *, size_t, const HUF_CElt *)"
                           );
            }
            lVar1 = (long)(int)srcSize;
            lVar10 = 7;
            do {
              if (lVar10 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar1 + -8) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                uVar12 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
                uVar9 = uVar12 & 0xff;
                if (uVar9 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                  if (uVar9 == 0) goto LAB_001825f0;
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                  bitC.ptr = bitC.ptr + (uVar9 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                  srcSize = lVar1 - 8;
                  goto LAB_001818a1;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar10 + lVar1 + -8) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar10 = lVar10 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar6 = (byte *)((long)iVar11 + (long)src);
            do {
              pbVar6 = pbVar6 + -1;
              if ((int)uVar12 < 1) {
                uVar9 = bitC.bitPos[0] & 0xff;
                cVar2 = (char)bitC.bitPos[0];
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (0x40 < (uint)uVar9) goto LAB_00182707;
                if (bitC.endPtr < dst) goto LAB_0018260f;
                *(size_t *)dst = bitC.bitContainer[0] >> (-cVar2 & 0x3fU);
                bitC.ptr = (BYTE *)((long)dst + (uVar9 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001817c7;
                goto LAB_0018262e;
              }
              uVar9 = CTable[(ulong)*pbVar6 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9 & 0xffffffffffffff00;
              uVar12 = (ulong)((int)uVar12 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        case 8:
          uVar9 = (long)((ulong)uVar3 << 0x20 | srcSize & 0xffffffff) % 7;
          uVar12 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_00181a83:
            uVar4 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 7) != 0)
            goto LAB_0018268b;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 0xe) == 0) {
LAB_001821f7:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       0xe) != 0) goto LAB_001826aa;
              lVar1 = (long)(int)srcSize;
              lVar5 = (long)src + lVar1 + -1;
              lVar10 = lVar1 + -8 + (long)src;
              for (; bVar14 = lVar1 == 0, lVar7 = 6, 0 < lVar1; lVar1 = lVar1 + -0xe) {
                while (lVar7 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar5 + -6 + lVar7) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar7 = lVar7 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_00180eb8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar1 + -7 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                uVar12 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_00180eb8;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                puVar8 = (ulong *)(bitC.ptr + (uVar9 >> 3));
                if (bitC.endPtr < puVar8) goto LAB_0018262e;
                sVar13 = 0;
                uVar9 = 0;
                lVar7 = 6;
                while (lVar7 != 0) {
                  uVar12 = CTable[(ulong)*(byte *)(lVar10 + -6 + lVar7) + 1];
                  if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                  uVar9 = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                  sVar13 = sVar13 + uVar12;
                  lVar7 = lVar7 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar13;
                  if (0x40 < ((uint)sVar13 & 0xff)) goto LAB_00180eb8;
                }
                uVar12 = CTable[(ulong)*(byte *)((long)src + lVar1 + -0xe) + 1];
                if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                bitC.bitPos[1] = sVar13 + uVar12;
                bitC.bitContainer[1] = uVar12 & 0xffffffffffffff00 | uVar9 >> ((byte)uVar12 & 0x3f);
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_00180eb8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_0018264d;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> ((byte)bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar12 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_0018266c;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                *puVar8 = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                bitC.ptr = (BYTE *)((uVar9 >> 3) + (long)puVar8);
                if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                lVar5 = lVar5 + -0xe;
                lVar10 = lVar10 + -0xe;
              }
              goto LAB_001825ab;
            }
            lVar1 = (long)(int)srcSize;
            lVar10 = 6;
            do {
              if (lVar10 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar1 + -7) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                uVar12 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
                uVar9 = uVar12 & 0xff;
                if (uVar9 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                  if (uVar9 == 0) goto LAB_001825f0;
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                  bitC.ptr = bitC.ptr + (uVar9 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                  srcSize = lVar1 - 7;
                  goto LAB_001821f7;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar10 + lVar1 + -7) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar10 = lVar10 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar6 = (byte *)((long)iVar11 + (long)src);
            do {
              pbVar6 = pbVar6 + -1;
              if ((int)uVar12 < 1) {
                uVar9 = bitC.bitPos[0] & 0xff;
                cVar2 = (char)bitC.bitPos[0];
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (0x40 < (uint)uVar9) goto LAB_00182707;
                if (bitC.endPtr < dst) goto LAB_0018260f;
                *(size_t *)dst = bitC.bitContainer[0] >> (-cVar2 & 0x3fU);
                bitC.ptr = (BYTE *)((long)dst + (uVar9 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_00181a83;
                goto LAB_0018262e;
              }
              uVar9 = CTable[(ulong)*pbVar6 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9 & 0xffffffffffffff00;
              uVar12 = (ulong)((int)uVar12 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        case 9:
          uVar9 = (long)((ulong)uVar3 << 0x20 | srcSize & 0xffffffff) % 6;
          uVar12 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001815f4:
            uVar4 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 6) != 0)
            goto LAB_0018268b;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 0xc) == 0) {
LAB_00181e3c:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       0xc) != 0) goto LAB_001826aa;
              lVar1 = (long)(int)srcSize;
              lVar5 = (long)src + lVar1 + -1;
              lVar10 = lVar1 + -7 + (long)src;
              for (; bVar14 = lVar1 == 0, lVar7 = 5, 0 < lVar1; lVar1 = lVar1 + -0xc) {
                while (lVar7 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar5 + -5 + lVar7) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar7 = lVar7 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_00180eb8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar1 + -6 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                uVar12 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_00180eb8;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                puVar8 = (ulong *)(bitC.ptr + (uVar9 >> 3));
                if (bitC.endPtr < puVar8) goto LAB_0018262e;
                sVar13 = 0;
                uVar9 = 0;
                lVar7 = 5;
                while (lVar7 != 0) {
                  uVar12 = CTable[(ulong)*(byte *)(lVar10 + -5 + lVar7) + 1];
                  if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                  uVar9 = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                  sVar13 = sVar13 + uVar12;
                  lVar7 = lVar7 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar13;
                  if (0x40 < ((uint)sVar13 & 0xff)) goto LAB_00180eb8;
                }
                uVar12 = CTable[(ulong)*(byte *)((long)src + lVar1 + -0xc) + 1];
                if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                bitC.bitPos[1] = sVar13 + uVar12;
                bitC.bitContainer[1] = uVar12 & 0xffffffffffffff00 | uVar9 >> ((byte)uVar12 & 0x3f);
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_00180eb8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_0018264d;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> ((byte)bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar12 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_0018266c;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                *puVar8 = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                bitC.ptr = (BYTE *)((uVar9 >> 3) + (long)puVar8);
                if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                lVar5 = lVar5 + -0xc;
                lVar10 = lVar10 + -0xc;
              }
              goto LAB_001825ab;
            }
            lVar1 = (long)(int)srcSize;
            lVar10 = 5;
            do {
              if (lVar10 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar1 + -6) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                uVar12 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
                uVar9 = uVar12 & 0xff;
                if (uVar9 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                  if (uVar9 == 0) goto LAB_001825f0;
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                  bitC.ptr = bitC.ptr + (uVar9 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                  srcSize = lVar1 - 6;
                  goto LAB_00181e3c;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar10 + lVar1 + -6) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar10 = lVar10 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar6 = (byte *)((long)iVar11 + (long)src);
            do {
              pbVar6 = pbVar6 + -1;
              if ((int)uVar12 < 1) {
                uVar9 = bitC.bitPos[0] & 0xff;
                cVar2 = (char)bitC.bitPos[0];
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (0x40 < (uint)uVar9) goto LAB_00182707;
                if (bitC.endPtr < dst) goto LAB_0018260f;
                *(size_t *)dst = bitC.bitContainer[0] >> (-cVar2 & 0x3fU);
                bitC.ptr = (BYTE *)((long)dst + (uVar9 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001815f4;
                goto LAB_0018262e;
              }
              uVar9 = CTable[(ulong)*pbVar6 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9 & 0xffffffffffffff00;
              uVar12 = (ulong)((int)uVar12 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        case 10:
          uVar9 = (long)((ulong)uVar3 << 0x20 | srcSize & 0xffffffff) % 5;
          uVar12 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_001816e1:
            uVar4 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 5) != 0)
            goto LAB_0018268b;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 10) == 0) {
LAB_00182021:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       10) != 0) goto LAB_001826aa;
              lVar1 = (long)(int)srcSize;
              lVar5 = (long)src + lVar1 + -1;
              lVar10 = lVar1 + -6 + (long)src;
              for (; bVar14 = lVar1 == 0, lVar7 = 4, 0 < lVar1; lVar1 = lVar1 + -10) {
                while (lVar7 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar5 + -4 + lVar7) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar7 = lVar7 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_00180eb8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar1 + -5 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                uVar9 = bitC.bitPos[0] + uVar9;
                uVar12 = uVar9 & 0xff;
                if (0x40 < uVar12) goto LAB_00180eb8;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar12 == 0) goto LAB_001825f0;
                if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar9 & 0x3fU);
                puVar8 = (ulong *)(bitC.ptr + (uVar12 >> 3));
                if (bitC.endPtr < puVar8) goto LAB_0018262e;
                sVar13 = 0;
                uVar9 = 0;
                lVar7 = 4;
                while (lVar7 != 0) {
                  uVar12 = CTable[(ulong)*(byte *)(lVar10 + -4 + lVar7) + 1];
                  if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                  uVar9 = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                  sVar13 = sVar13 + uVar12;
                  lVar7 = lVar7 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar13;
                  if (0x40 < ((uint)sVar13 & 0xff)) goto LAB_00180eb8;
                }
                uVar12 = CTable[(ulong)*(byte *)((long)src + lVar1 + -10) + 1];
                if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                bitC.bitContainer[1] = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                bitC.bitPos[1] = sVar13 + uVar12;
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_00180eb8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_0018264d;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> ((byte)bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar12 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_0018266c;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                *puVar8 = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                bitC.ptr = (BYTE *)((uVar9 >> 3) + (long)puVar8);
                if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                lVar5 = lVar5 + -10;
                lVar10 = lVar10 + -10;
              }
              goto LAB_001825ab;
            }
            lVar1 = (long)(int)srcSize;
            lVar10 = 4;
            do {
              if (lVar10 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar1 + -5) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                uVar9 = bitC.bitPos[0] + uVar9;
                uVar12 = uVar9 & 0xff;
                if (uVar12 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                  if (uVar12 == 0) goto LAB_001825f0;
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar9 & 0x3fU);
                  bitC.ptr = bitC.ptr + (uVar12 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                  srcSize = lVar1 - 5;
                  goto LAB_00182021;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar10 + lVar1 + -5) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar10 = lVar10 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar6 = (byte *)((long)iVar11 + (long)src);
            do {
              pbVar6 = pbVar6 + -1;
              if ((int)uVar12 < 1) {
                uVar9 = bitC.bitPos[0] & 0xff;
                cVar2 = (char)bitC.bitPos[0];
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (0x40 < (uint)uVar9) goto LAB_00182707;
                if (bitC.endPtr < dst) goto LAB_0018260f;
                *(size_t *)dst = bitC.bitContainer[0] >> (-cVar2 & 0x3fU);
                bitC.ptr = (BYTE *)((long)dst + (uVar9 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_001816e1;
                goto LAB_0018262e;
              }
              uVar9 = CTable[(ulong)*pbVar6 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9 & 0xffffffffffffff00;
              uVar12 = (ulong)((int)uVar12 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        case 0xb:
          uVar9 = (long)((ulong)uVar3 << 0x20 | srcSize & 0xffffffff) % 5;
          uVar12 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_00181508:
            uVar4 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 5) != 0)
            goto LAB_0018268b;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 10) == 0) {
LAB_00181c57:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       10) != 0) goto LAB_001826aa;
              lVar1 = (long)(int)srcSize;
              lVar5 = (long)src + lVar1 + -1;
              lVar10 = lVar1 + -6 + (long)src;
              for (; bVar14 = lVar1 == 0, lVar7 = 4, 0 < lVar1; lVar1 = lVar1 + -10) {
                while (lVar7 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar5 + -4 + lVar7) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar7 = lVar7 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_00180eb8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar1 + -5 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                uVar12 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_00180eb8;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                puVar8 = (ulong *)(bitC.ptr + (uVar9 >> 3));
                if (bitC.endPtr < puVar8) goto LAB_0018262e;
                sVar13 = 0;
                uVar9 = 0;
                lVar7 = 4;
                while (lVar7 != 0) {
                  uVar12 = CTable[(ulong)*(byte *)(lVar10 + -4 + lVar7) + 1];
                  if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                  uVar9 = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                  sVar13 = sVar13 + uVar12;
                  lVar7 = lVar7 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar13;
                  if (0x40 < ((uint)sVar13 & 0xff)) goto LAB_00180eb8;
                }
                uVar12 = CTable[(ulong)*(byte *)((long)src + lVar1 + -10) + 1];
                if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                bitC.bitPos[1] = sVar13 + uVar12;
                bitC.bitContainer[1] = uVar12 & 0xffffffffffffff00 | uVar9 >> ((byte)uVar12 & 0x3f);
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_00180eb8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_0018264d;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> ((byte)bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar12 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_0018266c;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                *puVar8 = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                bitC.ptr = (BYTE *)((uVar9 >> 3) + (long)puVar8);
                if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                lVar5 = lVar5 + -10;
                lVar10 = lVar10 + -10;
              }
              goto LAB_001825ab;
            }
            lVar1 = (long)(int)srcSize;
            lVar10 = 4;
            do {
              if (lVar10 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar1 + -5) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                uVar12 = bitC.bitPos[0] + uVar9;
                bitC.bitContainer[0] =
                     uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
                uVar9 = uVar12 & 0xff;
                if (uVar9 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                  if (uVar9 == 0) goto LAB_001825f0;
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                  bitC.ptr = bitC.ptr + (uVar9 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                  srcSize = lVar1 - 5;
                  goto LAB_00181c57;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar10 + lVar1 + -5) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar10 = lVar10 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar6 = (byte *)((long)iVar11 + (long)src);
            do {
              pbVar6 = pbVar6 + -1;
              if ((int)uVar12 < 1) {
                uVar9 = bitC.bitPos[0] & 0xff;
                cVar2 = (char)bitC.bitPos[0];
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (0x40 < (uint)uVar9) goto LAB_00182707;
                if (bitC.endPtr < dst) goto LAB_0018260f;
                *(size_t *)dst = bitC.bitContainer[0] >> (-cVar2 & 0x3fU);
                bitC.ptr = (BYTE *)((long)dst + (uVar9 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_00181508;
                goto LAB_0018262e;
              }
              uVar9 = CTable[(ulong)*pbVar6 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9 & 0xffffffffffffff00;
              uVar12 = (ulong)((int)uVar12 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          break;
        default:
          uVar9 = (long)((ulong)uVar3 << 0x20 | srcSize & 0xffffffff) % 9;
          uVar12 = uVar9 & 0xffffffff;
          if ((int)uVar9 < 1) {
LAB_00181b6f:
            uVar4 = (int)srcSize >> 0x1f;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 9) != 0)
            goto LAB_0018268b;
            if ((int)((long)((ulong)uVar4 << 0x20 | srcSize & 0xffffffff) % 0x12) == 0) {
LAB_001823dc:
              if ((int)((long)((ulong)(uint)((int)srcSize >> 0x1f) << 0x20 | srcSize & 0xffffffff) %
                       0x12) != 0) goto LAB_001826aa;
              lVar1 = (long)(int)srcSize;
              lVar5 = (long)src + lVar1 + -1;
              lVar10 = lVar1 + -10 + (long)src;
              for (; bVar14 = lVar1 == 0, lVar7 = 8, 0 < lVar1; lVar1 = lVar1 + -0x12) {
                while (lVar7 != 0) {
                  uVar9 = CTable[(ulong)*(byte *)(lVar5 + -8 + lVar7) + 1];
                  if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                  bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                  bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                  lVar7 = lVar7 + -1;
                  if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_00180eb8;
                }
                uVar9 = CTable[(ulong)*(byte *)(lVar1 + -9 + (long)src) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                uVar9 = bitC.bitPos[0] + uVar9;
                uVar12 = uVar9 & 0xff;
                if (0x40 < uVar12) goto LAB_00180eb8;
                bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                if (uVar12 == 0) goto LAB_001825f0;
                if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar9 & 0x3fU);
                puVar8 = (ulong *)(bitC.ptr + (uVar12 >> 3));
                if (bitC.endPtr < puVar8) goto LAB_0018262e;
                sVar13 = 0;
                uVar9 = 0;
                lVar7 = 8;
                while (lVar7 != 0) {
                  uVar12 = CTable[(ulong)*(byte *)(lVar10 + -8 + lVar7) + 1];
                  if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                  uVar9 = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                  sVar13 = sVar13 + uVar12;
                  lVar7 = lVar7 + -1;
                  bitC.bitContainer[1] = uVar9;
                  bitC.bitPos[1] = sVar13;
                  if (0x40 < ((uint)sVar13 & 0xff)) goto LAB_00180eb8;
                }
                uVar12 = CTable[(ulong)*(byte *)((long)src + lVar1 + -0x12) + 1];
                if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                bitC.bitContainer[1] = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                bitC.bitPos[1] = sVar13 + uVar12;
                if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_00180eb8;
                if ((int)(bitC.bitPos[1] & 0xff) == 0x40) goto LAB_0018264d;
                bitC.bitContainer[0] =
                     bitC.bitContainer[0] >> ((byte)bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
                uVar12 = bitC.bitPos[1] + bitC.bitPos[0];
                uVar9 = uVar12 & 0xff;
                if (0x40 < uVar9) goto LAB_0018266c;
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                *puVar8 = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                bitC.ptr = (BYTE *)((uVar9 >> 3) + (long)puVar8);
                if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                lVar5 = lVar5 + -0x12;
                lVar10 = lVar10 + -0x12;
              }
              goto LAB_001825ab;
            }
            lVar1 = (long)(int)srcSize;
            lVar10 = 8;
            do {
              if (lVar10 == 0) {
                uVar9 = CTable[(ulong)*(byte *)((long)src + lVar1 + -9) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                uVar9 = bitC.bitPos[0] + uVar9;
                uVar12 = uVar9 & 0xff;
                if (uVar12 < 0x41) {
                  bitC.bitPos[0] = (size_t)((uint)uVar9 & 7);
                  if (uVar12 == 0) goto LAB_001825f0;
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                  *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar9 & 0x3fU);
                  bitC.ptr = bitC.ptr + (uVar12 >> 3);
                  if (bitC.endPtr < bitC.ptr) goto LAB_0018262e;
                  srcSize = lVar1 - 9;
                  goto LAB_001823dc;
                }
                break;
              }
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar10 + lVar1 + -9) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              lVar10 = lVar10 + -1;
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
          else {
            pbVar6 = (byte *)((long)iVar11 + (long)src);
            do {
              pbVar6 = pbVar6 + -1;
              if ((int)uVar12 < 1) {
                uVar9 = bitC.bitPos[0] & 0xff;
                cVar2 = (char)bitC.bitPos[0];
                bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (0x40 < (uint)uVar9) goto LAB_00182707;
                if (bitC.endPtr < dst) goto LAB_0018260f;
                *(size_t *)dst = bitC.bitContainer[0] >> (-cVar2 & 0x3fU);
                bitC.ptr = (BYTE *)((long)dst + (uVar9 >> 3));
                if (bitC.ptr <= bitC.endPtr) goto LAB_00181b6f;
                goto LAB_0018262e;
              }
              uVar9 = CTable[(ulong)*pbVar6 + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9 & 0xffffffffffffff00;
              uVar12 = (ulong)((int)uVar12 - 1);
              srcSize = (size_t)((int)srcSize - 1);
            } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
          }
        }
      }
      else {
        uVar9 = (long)((ulong)uVar3 << 0x20 | srcSize & 0xffffffff) % 4;
        uVar12 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
LAB_00180e58:
          if ((srcSize & 3) != 0) goto LAB_0018268b;
          if ((srcSize & 4) == 0) {
LAB_00180f46:
            if ((srcSize & 7) != 0) goto LAB_001826aa;
            lVar1 = (long)(int)srcSize;
            lVar5 = (long)src + lVar1 + -1;
            lVar10 = lVar1 + -5 + (long)src;
            for (; bVar14 = lVar1 == 0, lVar7 = 3, 0 < lVar1; lVar1 = lVar1 + -8) {
              while (lVar7 != 0) {
                uVar9 = CTable[(ulong)*(byte *)(lVar5 + -3 + lVar7) + 1];
                if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
                bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
                bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
                lVar7 = lVar7 + -1;
                if (0x40 < ((uint)bitC.bitPos[0] & 0xff)) goto LAB_00180eb8;
              }
              uVar9 = CTable[(ulong)*(byte *)(lVar1 + -4 + (long)src) + 1];
              if (0xc < (uVar9 & 0xff)) {
LAB_001825d1:
                __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e2b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
              }
              uVar12 = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
              uVar9 = uVar12 & 0xff;
              if (0x40 < uVar9) goto LAB_00180eb8;
              bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
              if (uVar9 == 0) {
LAB_001825f0:
                __assert_fail("nbBits > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e6d,"void HUF_flushBits(HUF_CStream_t *, int)");
              }
              if (bitC.endPtr < bitC.ptr) {
LAB_0018260f:
                __assert_fail("bitC->ptr <= bitC->endPtr",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e6f,"void HUF_flushBits(HUF_CStream_t *, int)");
              }
              *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
              puVar8 = (ulong *)(bitC.ptr + (uVar9 >> 3));
              if (bitC.endPtr < bitC.ptr + (uVar9 >> 3)) {
                puVar8 = (ulong *)bitC.endPtr;
              }
              sVar13 = 0;
              uVar9 = 0;
              lVar7 = 3;
              while (lVar7 != 0) {
                uVar12 = CTable[(ulong)*(byte *)(lVar10 + -3 + lVar7) + 1];
                if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
                uVar9 = uVar9 >> ((byte)uVar12 & 0x3f) | uVar12;
                sVar13 = sVar13 + uVar12;
                lVar7 = lVar7 + -1;
                bitC.bitContainer[1] = uVar9;
                bitC.bitPos[1] = sVar13;
                if (0x40 < ((uint)sVar13 & 0xff)) goto LAB_00180eb8;
              }
              uVar12 = CTable[(ulong)*(byte *)((long)src + lVar1 + -8) + 1];
              if (0xc < (uVar12 & 0xff)) goto LAB_001825d1;
              bitC.bitPos[1] = sVar13 + uVar12;
              bitC.bitContainer[1] = uVar12 & 0xffffffffffffff00 | uVar9 >> ((byte)uVar12 & 0x3f);
              if (0x40 < (bitC.bitPos[1] & 0xff)) goto LAB_00180eb8;
              if ((int)(bitC.bitPos[1] & 0xff) == 0x40) {
LAB_0018264d:
                __assert_fail("(bitC->bitPos[1] & 0xFF) < HUF_BITS_IN_CONTAINER",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e56,"void HUF_mergeIndex1(HUF_CStream_t *)");
              }
              bitC.bitContainer[0] =
                   bitC.bitContainer[0] >> ((byte)bitC.bitPos[1] & 0x3f) | bitC.bitContainer[1];
              uVar12 = bitC.bitPos[1] + bitC.bitPos[0];
              uVar9 = uVar12 & 0xff;
              if (0x40 < uVar9) {
LAB_0018266c:
                __assert_fail("(bitC->bitPos[0] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e5a,"void HUF_mergeIndex1(HUF_CStream_t *)");
              }
              bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
              if (uVar9 == 0) goto LAB_001825f0;
              *puVar8 = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
              bitC.ptr = (BYTE *)((uVar9 >> 3) + (long)puVar8);
              if (bitC.endPtr < bitC.ptr) {
                bitC.ptr = bitC.endPtr;
              }
              lVar5 = lVar5 + -8;
              lVar10 = lVar10 + -8;
            }
            goto LAB_001825ab;
          }
          lVar1 = (long)(int)srcSize;
          lVar10 = 3;
          do {
            if (lVar10 == 0) {
              uVar9 = CTable[(ulong)*(byte *)((long)src + lVar1 + -4) + 1];
              if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
              uVar12 = bitC.bitPos[0] + uVar9;
              bitC.bitContainer[0] =
                   uVar9 & 0xffffffffffffff00 | bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f);
              uVar9 = uVar12 & 0xff;
              if (uVar9 < 0x41) {
                bitC.bitPos[0] = (size_t)((uint)uVar12 & 7);
                if (uVar9 == 0) goto LAB_001825f0;
                if (bitC.endPtr < bitC.ptr) goto LAB_0018260f;
                srcSize = lVar1 - 4;
                *(size_t *)bitC.ptr = bitC.bitContainer[0] >> (-(char)uVar12 & 0x3fU);
                bitC.ptr = bitC.ptr + (uVar9 >> 3);
                if (bitC.endPtr < bitC.ptr) {
                  bitC.ptr = bitC.endPtr;
                }
                goto LAB_00180f46;
              }
              break;
            }
            uVar9 = CTable[(ulong)*(byte *)((long)src + lVar10 + lVar1 + -4) + 1];
            if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
            bitC.bitContainer[0] = bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
            bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
            lVar10 = lVar10 + -1;
          } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
        }
        else {
          pbVar6 = (byte *)((long)iVar11 + (long)src);
          do {
            pbVar6 = pbVar6 + -1;
            if ((int)uVar12 < 1) {
              uVar9 = bitC.bitPos[0] & 0xff;
              cVar2 = (char)bitC.bitPos[0];
              bitC.bitPos[0] = (size_t)((uint)bitC.bitPos[0] & 7);
              if (uVar9 == 0) goto LAB_001825f0;
              if (0x40 < (uint)uVar9) {
LAB_00182707:
                __assert_fail("nbBits <= sizeof(bitC->bitContainer[0]) * 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x3e6e,"void HUF_flushBits(HUF_CStream_t *, int)");
              }
              if (bitC.endPtr < dst) goto LAB_0018260f;
              bitC.ptr = (BYTE *)((uVar9 >> 3) + (long)dst);
              if (bitC.endPtr < bitC.ptr) {
                bitC.ptr = bitC.endPtr;
              }
              *(size_t *)dst = bitC.bitContainer[0] >> (-cVar2 & 0x3fU);
              goto LAB_00180e58;
            }
            uVar9 = CTable[(ulong)*pbVar6 + 1];
            if (0xc < (uVar9 & 0xff)) goto LAB_001825d1;
            bitC.bitPos[0] = bitC.bitPos[0] + uVar9;
            bitC.bitContainer[0] =
                 bitC.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9 & 0xffffffffffffff00;
            uVar12 = (ulong)((int)uVar12 - 1);
            srcSize = (size_t)((int)srcSize - 1);
          } while (((uint)bitC.bitPos[0] & 0xff) < 0x41);
        }
      }
LAB_00180eb8:
      __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3e37,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
    }
  }
  return 0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = (U32)CTable[0];
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}